

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void embree::errorFunc(int error,char *description)

{
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Error: ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_48);
  local_68 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_68 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void errorFunc(int error, const char* description) {
    throw std::runtime_error(std::string("Error: ")+description);
  }